

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

void Gia_ManFindUnatePairs
               (word **pSets,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vBinateVars,
               Vec_Int_t **vUnatePairs,int fVerbose)

{
  int iVar1;
  ulong uVar2;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong uVar3;
  
  uVar2 = (ulong)(uint)nWords;
  if (fVerbose != 0) {
    printf("  ");
    uVar2 = extraout_RDX;
  }
  for (uVar3 = 0; uVar3 != 2; uVar3 = uVar3 + 1) {
    iVar1 = vUnatePairs[uVar3]->nSize;
    Gia_ManFindUnatePairsInt
              (pSets[uVar3],pSets[uVar3 ^ 1],vBinateVars,vDivs,nWords,vUnatePairs[uVar3]);
    uVar2 = extraout_RDX_00;
    if (fVerbose != 0) {
      printf("UP%d =%5d ",uVar3 & 0xffffffff,(ulong)(uint)(vUnatePairs[uVar3]->nSize - iVar1));
      uVar2 = extraout_RDX_01;
    }
  }
  iVar1 = Gia_ManFindFirstCommonLit(*vUnatePairs,vUnatePairs[1],(int)uVar2);
  if (iVar1 == -1) {
    return;
  }
  __assert_fail("RetValue == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                ,0x369,
                "void Gia_ManFindUnatePairs(word **, Vec_Ptr_t *, int, Vec_Int_t *, Vec_Int_t **, int)"
               );
}

Assistant:

void Gia_ManFindUnatePairs( word * pSets[2], Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vBinateVars, Vec_Int_t * vUnatePairs[2], int fVerbose )
{
    int n, RetValue;
    if ( fVerbose ) printf( "  " );
    for ( n = 0; n < 2; n++ )
    {
        int nBefore = Vec_IntSize(vUnatePairs[n]);
        Gia_ManFindUnatePairsInt( pSets[n], pSets[!n], vBinateVars, vDivs, nWords, vUnatePairs[n] );
        if ( fVerbose ) printf( "UP%d =%5d ", n, Vec_IntSize(vUnatePairs[n])-nBefore );
    }
    RetValue = Gia_ManFindFirstCommonLit( vUnatePairs[0], vUnatePairs[1], fVerbose );
    assert( RetValue == -1 );
}